

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.c
# Opt level: O1

void device_fini(void *arg)

{
  nni_aio *pnVar1;
  long lVar2;
  
  if (0 < *(int *)((long)arg + 8)) {
    pnVar1 = (nni_aio *)((long)arg + 0x38);
    lVar2 = 0;
    do {
      nni_aio_stop(pnVar1);
      lVar2 = lVar2 + 1;
      pnVar1 = (nni_aio *)&pnVar1[1].a_task;
    } while (lVar2 < *(int *)((long)arg + 8));
  }
  if (0 < *(int *)((long)arg + 8)) {
    pnVar1 = (nni_aio *)((long)arg + 0x38);
    lVar2 = 0;
    do {
      nni_aio_fini(pnVar1);
      lVar2 = lVar2 + 1;
      pnVar1 = (nni_aio *)&pnVar1[1].a_task;
    } while (lVar2 < *(int *)((long)arg + 8));
  }
  nni_sock_rele(*(nni_sock **)((long)arg + 0x28));
  nni_sock_rele(*(nni_sock **)((long)arg + 0x30));
  nni_free(arg,0x3f0);
  return;
}

Assistant:

static void
device_fini(void *arg)
{
	device_data *d = arg;

	for (int i = 0; i < d->num_paths; i++) {
		nni_aio_stop(&d->paths[i].aio);
	}
	for (int i = 0; i < d->num_paths; i++) {
		nni_aio_fini(&d->paths[i].aio);
	}
	nni_sock_rele(d->paths[0].src);
	nni_sock_rele(d->paths[0].dst);
	NNI_FREE_STRUCT(d);
}